

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O2

Real ga_sdot_patch_(Integer *g_a,char *t_a,Integer *ailo,Integer *aihi,Integer *ajlo,Integer *ajhi,
                   Integer *g_b,char *t_b,Integer *bilo,Integer *bihi,Integer *bjlo,Integer *bjhi,
                   int alen,int blen)

{
  Integer btype;
  Real retval;
  Integer atype;
  
  pnga_inquire_type(*g_a,&atype);
  pnga_inquire_type(*g_b,&btype);
  if ((atype != 0x3eb) || (btype != 0x3eb)) {
    pnga_error(" wrong types ",0);
  }
  sga_dot_patch(*g_a,t_a,ailo,aihi,ajlo,ajhi,*g_b,t_b,bilo,bihi,bjlo,bjhi,&retval);
  return retval;
}

Assistant:

Real ga_sdot_patch_(Integer *g_a, char *t_a, int alen, Integer *ailo, Integer *aihi, Integer *ajlo, Integer *ajhi, Integer *g_b, char *t_b, int blen, Integer *bilo, Integer *bihi, Integer *bjlo, Integer *bjhi)
#endif
{
    Real retval;
    Integer atype, btype;

    pnga_inquire_type(*g_a, &atype);
    pnga_inquire_type(*g_b, &btype);
    if (atype != btype || atype != C_FLOAT) pnga_error(" wrong types ", 0L);
    sga_dot_patch(*g_a, t_a, ailo, aihi, ajlo, ajhi, *g_b, t_b, bilo, bihi, bjlo, bjhi, &retval);

    return retval;
}